

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  vfloat<4> vVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  vbool<4> vVar14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  long lVar18;
  ulong uVar19;
  NodeRef root;
  size_t sVar20;
  size_t sVar21;
  uint uVar22;
  ulong uVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar46;
  float fVar47;
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 bi;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar78;
  uint uVar79;
  uint uVar80;
  undefined1 auVar77 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_1978 [16];
  BVH *local_1968;
  Intersectors *local_1960;
  undefined1 local_1958 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [8];
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [8];
  float fStack_18a0;
  float fStack_189c;
  undefined1 local_1898 [8];
  float fStack_1890;
  float fStack_188c;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar13 = mm_lookupmask_ps._8_8_;
  uVar12 = mm_lookupmask_ps._0_8_;
  local_1968 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1968->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar34 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar35 = vpcmpeqd_avx(auVar34,(undefined1  [16])valid_i->field_0);
    auVar39 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39,5);
    auVar33 = auVar35 & auVar8;
    if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar35);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx(auVar81,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar69._8_4_ = 0x219392ef;
      auVar69._0_8_ = 0x219392ef219392ef;
      auVar69._12_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar35,auVar69,1);
      auVar33 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar69,auVar35);
      auVar35 = vandps_avx(auVar81,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar35 = vcmpps_avx(auVar35,auVar69,1);
      auVar53 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar69,auVar35);
      auVar35 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar81);
      auVar35 = vcmpps_avx(auVar35,auVar69,1);
      auVar35 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar69,auVar35);
      auVar56 = vrcpps_avx(auVar33);
      auVar70._8_4_ = 0x3f800000;
      auVar70._0_8_ = 0x3f8000003f800000;
      auVar70._12_4_ = 0x3f800000;
      auVar33 = vfnmadd213ps_fma(auVar33,auVar56,auVar70);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar33,auVar56,auVar56)
      ;
      auVar33 = vrcpps_avx(auVar53);
      auVar53 = vfnmadd213ps_fma(auVar53,auVar33,auVar70);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar33,auVar33)
      ;
      auVar33 = vrcpps_avx(auVar35);
      auVar35 = vfnmadd213ps_fma(auVar35,auVar33,auVar70);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar35,auVar33,auVar33)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar33._8_4_ = 0x10;
      auVar33._0_8_ = 0x1000000010;
      auVar33._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar35,auVar33);
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar53._8_4_ = 0x20;
      auVar53._0_8_ = 0x2000000020;
      auVar53._12_4_ = 0x20;
      auVar56._8_4_ = 0x30;
      auVar56._0_8_ = 0x3000000030;
      auVar56._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar56,auVar53,auVar35);
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar57._8_4_ = 0x40;
      auVar57._0_8_ = 0x4000000040;
      auVar57._12_4_ = 0x40;
      auVar61._8_4_ = 0x50;
      auVar61._0_8_ = 0x5000000050;
      auVar61._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar61,auVar57,auVar35);
      auVar35 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      auVar33 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar83 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar35,auVar8);
      auVar35._8_4_ = 0xff800000;
      auVar35._0_8_ = 0xff800000ff800000;
      auVar35._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar35,auVar33,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar34._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar34._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar34._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar34._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar22 = 3;
      }
      else {
        uVar22 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar24 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar26 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar34 = vpcmpeqd_avx(auVar8,auVar8);
      auVar77 = ZEXT1664(auVar34);
      local_1960 = This;
LAB_019be9ad:
      do {
        do {
          root.ptr = pNVar24[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019bf28f;
          pNVar24 = pNVar24 + -1;
          paVar26 = paVar26 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar26->v;
          auVar37 = ZEXT1664((undefined1  [16])vVar4.field_0);
          auVar34 = vcmpps_avx((undefined1  [16])vVar4.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar15 = vmovmskps_avx(auVar34);
        } while (uVar15 == 0);
        uVar25 = (ulong)(uVar15 & 0xff);
        uVar15 = POPCOUNT(uVar15 & 0xff);
        if (uVar22 < uVar15) {
LAB_019be9ed:
          do {
            vVar14.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019bf28f;
              auVar34 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar37._0_16_,6);
              if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar34[0xf]) goto LAB_019be9ad;
              uVar25 = (ulong)((uint)root.ptr & 0xf);
              if (uVar25 == 8) goto LAB_019bf18d;
              auVar39._0_4_ = auVar77._0_4_ ^ terminated.field_0._0_4_;
              auVar39._4_4_ = auVar77._4_4_ ^ terminated.field_0._4_4_;
              auVar39._8_4_ = auVar77._8_4_ ^ terminated.field_0._8_4_;
              auVar39._12_4_ = auVar77._12_4_ ^ terminated.field_0._12_4_;
              lVar18 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar23 = 0;
              goto LAB_019bebd2;
            }
            lVar18 = 0;
            sVar21 = 8;
            auVar34 = auVar83._0_16_;
            do {
              sVar20 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar18 * 8);
              if (sVar20 == 8) {
                auVar37 = ZEXT1664(auVar34);
                sVar20 = sVar21;
                break;
              }
              uVar17 = *(undefined4 *)(root.ptr + 0x20 + lVar18 * 4);
              auVar40._4_4_ = uVar17;
              auVar40._0_4_ = uVar17;
              auVar40._8_4_ = uVar17;
              auVar40._12_4_ = uVar17;
              auVar9._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar9._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar9._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar9._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar39 = vfmsub213ps_fma(auVar40,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar9);
              uVar17 = *(undefined4 *)(root.ptr + 0x40 + lVar18 * 4);
              auVar62._4_4_ = uVar17;
              auVar62._0_4_ = uVar17;
              auVar62._8_4_ = uVar17;
              auVar62._12_4_ = uVar17;
              auVar10._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar53 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x60 + lVar18 * 4);
              auVar66._4_4_ = uVar17;
              auVar66._0_4_ = uVar17;
              auVar66._8_4_ = uVar17;
              auVar66._12_4_ = uVar17;
              auVar11._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar56 = vfmsub213ps_fma(auVar66,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar11);
              uVar17 = *(undefined4 *)(root.ptr + 0x30 + lVar18 * 4);
              auVar71._4_4_ = uVar17;
              auVar71._0_4_ = uVar17;
              auVar71._8_4_ = uVar17;
              auVar71._12_4_ = uVar17;
              auVar57 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar9);
              uVar17 = *(undefined4 *)(root.ptr + 0x50 + lVar18 * 4);
              auVar58._4_4_ = uVar17;
              auVar58._0_4_ = uVar17;
              auVar58._8_4_ = uVar17;
              auVar58._12_4_ = uVar17;
              auVar61 = vfmsub213ps_fma(auVar58,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x70 + lVar18 * 4);
              auVar49._4_4_ = uVar17;
              auVar49._0_4_ = uVar17;
              auVar49._8_4_ = uVar17;
              auVar49._12_4_ = uVar17;
              auVar69 = vfmsub213ps_fma(auVar49,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar11);
              auVar35 = vpminsd_avx(auVar39,auVar57);
              auVar33 = vpminsd_avx(auVar53,auVar61);
              auVar35 = vpmaxsd_avx(auVar35,auVar33);
              auVar33 = vpminsd_avx(auVar56,auVar69);
              auVar33 = vpmaxsd_avx(auVar35,auVar33);
              auVar35 = vpmaxsd_avx(auVar39,auVar57);
              auVar39 = vpmaxsd_avx(auVar53,auVar61);
              auVar39 = vpminsd_avx(auVar35,auVar39);
              auVar35 = vpmaxsd_avx(auVar56,auVar69);
              auVar39 = vpminsd_avx(auVar39,auVar35);
              auVar35 = vpmaxsd_avx(auVar33,(undefined1  [16])tray.tnear.field_0);
              auVar39 = vpminsd_avx(auVar39,(undefined1  [16])tray.tfar.field_0);
              auVar35 = vcmpps_avx(auVar35,auVar39,2);
              if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar35[0xf]) {
                auVar37 = ZEXT1664(auVar34);
                sVar20 = sVar21;
              }
              else {
                auVar35 = vblendvps_avx(auVar83._0_16_,auVar33,auVar35);
                auVar37 = ZEXT1664(auVar35);
                if (sVar21 != 8) {
                  pNVar24->ptr = sVar21;
                  pNVar24 = pNVar24 + 1;
                  *(undefined1 (*) [16])paVar26->v = auVar34;
                  paVar26 = paVar26 + 1;
                }
              }
              lVar18 = lVar18 + 1;
              auVar34 = auVar37._0_16_;
              sVar21 = sVar20;
            } while (lVar18 != 4);
            iVar16 = 4;
            if (sVar20 == 8) goto LAB_019beb68;
            auVar34 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar37._0_16_,6);
            uVar17 = vmovmskps_avx(auVar34);
            root.ptr = sVar20;
          } while ((byte)uVar22 < (byte)POPCOUNT(uVar17));
          pNVar24->ptr = sVar20;
          pNVar24 = pNVar24 + 1;
          *paVar26 = auVar37._0_16_;
          paVar26 = paVar26 + 1;
        }
        else {
          do {
            sVar21 = 0;
            for (uVar23 = uVar25; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              sVar21 = sVar21 + 1;
            }
            auVar77 = ZEXT1664(auVar77._0_16_);
            bVar27 = occluded1(local_1960,local_1968,root,sVar21,&pre,ray,&tray,context);
            if (bVar27) {
              terminated.field_0.i[sVar21] = -1;
            }
            uVar25 = uVar25 - 1 & uVar25;
          } while (uVar25 != 0);
          auVar34 = vpcmpeqd_avx(auVar77._0_16_,auVar77._0_16_);
          auVar77 = ZEXT1664(auVar34);
          auVar34 = auVar34 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar34[0xf]) {
            iVar16 = 3;
          }
          else {
            auVar34._8_4_ = 0xff800000;
            auVar34._0_8_ = 0xff800000ff800000;
            auVar34._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar34,
                               (undefined1  [16])terminated.field_0);
            iVar16 = 2;
          }
          auVar83 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar37 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if (uVar22 < uVar15) goto LAB_019be9ed;
        }
LAB_019beb68:
      } while ((iVar16 == 4) || (iVar16 == 2));
LAB_019bf28f:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar36._8_4_ = 0xff800000;
      auVar36._0_8_ = 0xff800000ff800000;
      auVar36._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar36);
      *(undefined1 (*) [16])pRVar1 = auVar8;
    }
  }
  return;
  while( true ) {
    uVar23 = uVar23 + 1;
    lVar18 = lVar18 + 0xb0;
    auVar39 = auVar35;
    if (uVar25 - 8 <= uVar23) break;
LAB_019bebd2:
    uVar19 = 0;
    auVar34 = auVar39;
    while( true ) {
      uVar15 = *(uint *)(lVar18 + -0x10 + uVar19 * 4);
      if ((ulong)uVar15 == 0xffffffff) break;
      uVar17 = *(undefined4 *)(lVar18 + -0xa0 + uVar19 * 4);
      auVar50._4_4_ = uVar17;
      auVar50._0_4_ = uVar17;
      auVar50._8_4_ = uVar17;
      auVar50._12_4_ = uVar17;
      uVar17 = *(undefined4 *)(lVar18 + -0x90 + uVar19 * 4);
      auVar59._4_4_ = uVar17;
      auVar59._0_4_ = uVar17;
      auVar59._8_4_ = uVar17;
      auVar59._12_4_ = uVar17;
      uVar17 = *(undefined4 *)(lVar18 + -0x80 + uVar19 * 4);
      auVar64._4_4_ = uVar17;
      auVar64._0_4_ = uVar17;
      auVar64._8_4_ = uVar17;
      auVar64._12_4_ = uVar17;
      fVar38 = *(float *)(lVar18 + -0x70 + uVar19 * 4);
      auVar41._4_4_ = fVar38;
      auVar41._0_4_ = fVar38;
      auVar41._8_4_ = fVar38;
      auVar41._12_4_ = fVar38;
      fVar46 = *(float *)(lVar18 + -0x60 + uVar19 * 4);
      auVar68._4_4_ = fVar46;
      auVar68._0_4_ = fVar46;
      auVar68._8_4_ = fVar46;
      auVar68._12_4_ = fVar46;
      fVar47 = *(float *)(lVar18 + -0x50 + uVar19 * 4);
      auVar67._4_4_ = fVar47;
      auVar67._0_4_ = fVar47;
      auVar67._8_4_ = fVar47;
      auVar67._12_4_ = fVar47;
      fVar48 = *(float *)(lVar18 + -0x40 + uVar19 * 4);
      auVar72._4_4_ = fVar48;
      auVar72._0_4_ = fVar48;
      auVar72._8_4_ = fVar48;
      auVar72._12_4_ = fVar48;
      fVar2 = *(float *)(lVar18 + -0x30 + uVar19 * 4);
      auVar75._4_4_ = fVar2;
      auVar75._0_4_ = fVar2;
      auVar75._8_4_ = fVar2;
      auVar75._12_4_ = fVar2;
      fVar3 = *(float *)(lVar18 + -0x20 + uVar19 * 4);
      auVar82._4_4_ = fVar3;
      auVar82._0_4_ = fVar3;
      auVar82._8_4_ = fVar3;
      auVar82._12_4_ = fVar3;
      fVar46 = fVar46 * fVar3;
      auVar54._4_4_ = fVar46;
      auVar54._0_4_ = fVar46;
      auVar54._8_4_ = fVar46;
      auVar54._12_4_ = fVar46;
      auVar70 = vfmsub231ps_fma(auVar54,auVar75,auVar67);
      fVar48 = fVar47 * fVar48;
      auVar63._4_4_ = fVar48;
      auVar63._0_4_ = fVar48;
      auVar63._8_4_ = fVar48;
      auVar63._12_4_ = fVar48;
      auVar54 = vfmsub231ps_fma(auVar63,auVar82,auVar41);
      fVar2 = fVar2 * fVar38;
      auVar42._4_4_ = fVar2;
      auVar42._0_4_ = fVar2;
      auVar42._8_4_ = fVar2;
      auVar42._12_4_ = fVar2;
      auVar56 = vsubps_avx(auVar50,*(undefined1 (*) [16])ray);
      auVar57 = vsubps_avx(auVar59,*(undefined1 (*) [16])(ray + 0x10));
      auVar42 = vfmsub231ps_fma(auVar42,auVar72,auVar68);
      auVar61 = vsubps_avx(auVar64,*(undefined1 (*) [16])(ray + 0x20));
      auVar35 = *(undefined1 (*) [16])(ray + 0x40);
      auVar33 = *(undefined1 (*) [16])(ray + 0x50);
      auVar53 = *(undefined1 (*) [16])(ray + 0x60);
      auVar84._0_4_ = auVar35._0_4_ * auVar57._0_4_;
      auVar84._4_4_ = auVar35._4_4_ * auVar57._4_4_;
      auVar84._8_4_ = auVar35._8_4_ * auVar57._8_4_;
      auVar84._12_4_ = auVar35._12_4_ * auVar57._12_4_;
      auVar50 = vfmsub231ps_fma(auVar84,auVar56,auVar33);
      auVar65._0_4_ = auVar53._0_4_ * auVar42._0_4_;
      auVar65._4_4_ = auVar53._4_4_ * auVar42._4_4_;
      auVar65._8_4_ = auVar53._8_4_ * auVar42._8_4_;
      auVar65._12_4_ = auVar53._12_4_ * auVar42._12_4_;
      auVar69 = vfmadd231ps_fma(auVar65,auVar54,auVar33);
      auVar85._0_4_ = auVar33._0_4_ * auVar61._0_4_;
      auVar85._4_4_ = auVar33._4_4_ * auVar61._4_4_;
      auVar85._8_4_ = auVar33._8_4_ * auVar61._8_4_;
      auVar85._12_4_ = auVar33._12_4_ * auVar61._12_4_;
      auVar59 = vfmsub231ps_fma(auVar85,auVar57,auVar53);
      auVar86._0_4_ = auVar53._0_4_ * auVar56._0_4_;
      auVar86._4_4_ = auVar53._4_4_ * auVar56._4_4_;
      auVar86._8_4_ = auVar53._8_4_ * auVar56._8_4_;
      auVar86._12_4_ = auVar53._12_4_ * auVar56._12_4_;
      auVar63 = vfmsub231ps_fma(auVar86,auVar61,auVar35);
      auVar69 = vfmadd231ps_fma(auVar69,auVar70,auVar35);
      auVar28._0_4_ = fVar3 * auVar50._0_4_;
      auVar28._4_4_ = fVar3 * auVar50._4_4_;
      auVar28._8_4_ = fVar3 * auVar50._8_4_;
      auVar28._12_4_ = fVar3 * auVar50._12_4_;
      auVar33 = vfmadd231ps_fma(auVar28,auVar63,auVar75);
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar35 = vandps_avx(auVar76,auVar69);
      auVar33 = vfmadd231ps_fma(auVar33,auVar59,auVar72);
      uVar74 = auVar35._0_4_;
      auVar73._0_4_ = uVar74 ^ auVar33._0_4_;
      uVar78 = auVar35._4_4_;
      auVar73._4_4_ = uVar78 ^ auVar33._4_4_;
      uVar79 = auVar35._8_4_;
      auVar73._8_4_ = uVar79 ^ auVar33._8_4_;
      uVar80 = auVar35._12_4_;
      auVar73._12_4_ = uVar80 ^ auVar33._12_4_;
      auVar33 = vcmpps_avx(auVar73,_DAT_01f7aa10,5);
      auVar53 = auVar34 & auVar33;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
      {
LAB_019becf6:
        auVar7._8_8_ = uVar13;
        auVar7._0_8_ = uVar12;
      }
      else {
        auVar33 = vandps_avx(auVar33,auVar34);
        auVar30._0_4_ = fVar47 * auVar50._0_4_;
        auVar30._4_4_ = fVar47 * auVar50._4_4_;
        auVar30._8_4_ = fVar47 * auVar50._8_4_;
        auVar30._12_4_ = fVar47 * auVar50._12_4_;
        auVar53 = vfmadd132ps_fma(auVar63,auVar30,auVar68);
        auVar53 = vfmadd132ps_fma(auVar59,auVar53,auVar41);
        auVar55._0_4_ = uVar74 ^ auVar53._0_4_;
        auVar55._4_4_ = uVar78 ^ auVar53._4_4_;
        auVar55._8_4_ = uVar79 ^ auVar53._8_4_;
        auVar55._12_4_ = uVar80 ^ auVar53._12_4_;
        auVar53 = vcmpps_avx(auVar55,_DAT_01f7aa10,5);
        auVar50 = auVar33 & auVar53;
        local_1958 = auVar70;
        if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf]
           ) goto LAB_019becf6;
        auVar50 = vandps_avx(auVar69,auVar81);
        auVar33 = vandps_avx(auVar53,auVar33);
        auVar53 = vsubps_avx(auVar50,auVar73);
        auVar53 = vcmpps_avx(auVar53,auVar55,5);
        auVar59 = auVar33 & auVar53;
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]
           ) goto LAB_019becf6;
        auVar33 = vandps_avx(auVar53,auVar33);
        auVar31._0_4_ = auVar61._0_4_ * auVar42._0_4_;
        auVar31._4_4_ = auVar61._4_4_ * auVar42._4_4_;
        auVar31._8_4_ = auVar61._8_4_ * auVar42._8_4_;
        auVar31._12_4_ = auVar61._12_4_ * auVar42._12_4_;
        auVar53 = vfmadd213ps_fma(auVar57,auVar54,auVar31);
        auVar53 = vfmadd132ps_fma(auVar56,auVar53,auVar70);
        auVar60._0_4_ = uVar74 ^ auVar53._0_4_;
        auVar60._4_4_ = uVar78 ^ auVar53._4_4_;
        auVar60._8_4_ = uVar79 ^ auVar53._8_4_;
        auVar60._12_4_ = uVar80 ^ auVar53._12_4_;
        auVar32._0_4_ = auVar50._0_4_ * *(float *)(ray + 0x30);
        auVar32._4_4_ = auVar50._4_4_ * *(float *)(ray + 0x34);
        auVar32._8_4_ = auVar50._8_4_ * *(float *)(ray + 0x38);
        auVar32._12_4_ = auVar50._12_4_ * *(float *)(ray + 0x3c);
        auVar52._0_4_ = auVar50._0_4_ * *(float *)(ray + 0x80);
        auVar52._4_4_ = auVar50._4_4_ * *(float *)(ray + 0x84);
        auVar52._8_4_ = auVar50._8_4_ * *(float *)(ray + 0x88);
        auVar52._12_4_ = auVar50._12_4_ * *(float *)(ray + 0x8c);
        auVar53 = vcmpps_avx(auVar32,auVar60,1);
        auVar56 = vcmpps_avx(auVar60,auVar52,2);
        auVar53 = vandps_avx(auVar56,auVar53);
        auVar56 = auVar33 & auVar53;
        if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar56[0xf]
           ) {
LAB_019bf150:
          auVar7._8_8_ = uVar13;
          auVar7._0_8_ = uVar12;
        }
        else {
          auVar33 = vandps_avx(auVar33,auVar53);
          auVar53 = vcmpps_avx(auVar69,_DAT_01f7aa10,4);
          auVar56 = auVar33 & auVar53;
          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar56[0xf]) goto LAB_019bf150;
          auVar7 = vandps_avx(auVar53,auVar33);
          local_1958._0_8_ = auVar70._0_8_;
          local_1958._8_8_ = auVar70._8_8_;
          local_18d8 = local_1958._0_8_;
          uStack_18d0 = local_1958._8_8_;
          local_18f8 = auVar42;
          local_18e8 = auVar54;
          local_18c8 = auVar50;
          _local_18b8 = auVar60;
          _local_18a8 = auVar55;
          _local_1898 = auVar73;
        }
      }
      pGVar5 = (context->scene->geometries).items[uVar15].ptr;
      uVar74 = pGVar5->mask;
      auVar29._4_4_ = uVar74;
      auVar29._0_4_ = uVar74;
      auVar29._8_4_ = uVar74;
      auVar29._12_4_ = uVar74;
      auVar33 = vpand_avx(auVar29,*(undefined1 (*) [16])(ray + 0x90));
      auVar33 = vpcmpeqd_avx(auVar33,_DAT_01f7aa10);
      auVar53 = auVar7 & ~auVar33;
      auVar83 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      auVar77 = ZEXT1664(auVar35);
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        uVar17 = *(undefined4 *)(lVar18 + uVar19 * 4);
        auVar33 = vandnps_avx(auVar33,auVar7);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar53 = vrcpps_avx(local_18c8);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar56 = vfnmadd213ps_fma(auVar53,local_18c8,auVar51);
          auVar53 = vfmadd132ps_fma(auVar56,auVar53,auVar53);
          fVar38 = auVar53._0_4_;
          local_1738._0_4_ = fVar38 * (float)local_1898._0_4_;
          fVar46 = auVar53._4_4_;
          local_1738._4_4_ = fVar46 * (float)local_1898._4_4_;
          fVar47 = auVar53._8_4_;
          local_1738._8_4_ = fVar47 * fStack_1890;
          fVar48 = auVar53._12_4_;
          local_1738._12_4_ = fVar48 * fStack_188c;
          local_1728 = fVar38 * (float)local_18a8._0_4_;
          fStack_1724 = fVar46 * (float)local_18a8._4_4_;
          fStack_1720 = fVar47 * fStack_18a0;
          fStack_171c = fVar48 * fStack_189c;
          local_1718._4_4_ = uVar17;
          local_1718._0_4_ = uVar17;
          local_1718._8_4_ = uVar17;
          local_1718._12_4_ = uVar17;
          local_1768 = local_18d8;
          uStack_1760 = uStack_18d0;
          local_1758 = local_18e8._0_8_;
          uStack_1750 = local_18e8._8_8_;
          local_1748 = local_18f8;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          auVar43._0_4_ = fVar38 * (float)local_18b8._0_4_;
          auVar43._4_4_ = fVar46 * (float)local_18b8._4_4_;
          auVar43._8_4_ = fVar47 * fStack_18b0;
          auVar43._12_4_ = fVar48 * fStack_18ac;
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar53 = *(undefined1 (*) [16])(ray + 0x80);
          auVar56 = vblendvps_avx(auVar53,auVar43,auVar33);
          *(undefined1 (*) [16])(ray + 0x80) = auVar56;
          args.valid = (int *)local_1978;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1978 = auVar33;
          args.ray = (RTCRayN *)ray;
          local_1708 = uVar15;
          uStack_1704 = uVar15;
          uStack_1700 = uVar15;
          uStack_16fc = uVar15;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
            auVar83 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1978 == (undefined1  [16])0x0) {
            auVar33 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar35 = vpcmpeqd_avx(auVar35,auVar35);
            auVar77 = ZEXT1664(auVar35);
            auVar35 = auVar35 ^ auVar33;
          }
          else {
            p_Var6 = context->args->filter;
            auVar35 = vpcmpeqd_avx(auVar35,auVar35);
            auVar77 = ZEXT1664(auVar35);
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&args);
              auVar35 = vpcmpeqd_avx(auVar35,auVar35);
              auVar77 = ZEXT1664(auVar35);
              auVar83 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar33 = vpcmpeqd_avx(local_1978,_DAT_01f7aa10);
            auVar35 = auVar77._0_16_ ^ auVar33;
            auVar44._8_4_ = 0xff800000;
            auVar44._0_8_ = 0xff800000ff800000;
            auVar44._12_4_ = 0xff800000;
            auVar33 = vblendvps_avx(auVar44,*(undefined1 (*) [16])(args.ray + 0x80),auVar33);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar33;
          }
          auVar35 = vpslld_avx(auVar35,0x1f);
          auVar33 = vpsrad_avx(auVar35,0x1f);
          auVar35 = vblendvps_avx(auVar53,*(undefined1 (*) [16])pRVar1,auVar35);
          *(undefined1 (*) [16])pRVar1 = auVar35;
        }
        auVar34 = vpandn_avx(auVar33,auVar34);
      }
      if (((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
         || (bVar27 = 2 < uVar19, uVar19 = uVar19 + 1, bVar27)) break;
    }
    auVar35 = vandps_avx(auVar34,auVar39);
    auVar39 = auVar39 & auVar34;
    if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar39[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar77._0_4_ ^ auVar35._0_4_;
  terminated.field_0.i[1] = auVar77._4_4_ ^ auVar35._4_4_;
  terminated.field_0.i[2] = auVar77._8_4_ ^ auVar35._8_4_;
  terminated.field_0.i[3] = auVar77._12_4_ ^ auVar35._12_4_;
LAB_019bf18d:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar14.field_0,(undefined1  [16])terminated.field_0);
  auVar34 = auVar77._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
  goto LAB_019bf28f;
  auVar45._8_4_ = 0xff800000;
  auVar45._0_8_ = 0xff800000ff800000;
  auVar45._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar45,
                     (undefined1  [16])terminated.field_0);
  goto LAB_019be9ad;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }